

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_dosettracing(_glist *x,int onoff)

{
  t_object *ob_00;
  t_object *ob;
  t_gobj *y;
  int onoff_local;
  _glist *x_local;
  
  for (ob = (t_object *)x->gl_list; ob != (t_object *)0x0; ob = (t_object *)(ob->te_g).g_next) {
    if ((ob->te_g).g_pd == canvas_class) {
      canvas_dosettracing((_glist *)ob,onoff);
    }
    ob_00 = pd_checkobject((t_pd *)ob);
    if (ob_00 != (t_object *)0x0) {
      obj_dosettracing(ob_00,onoff);
    }
  }
  return;
}

Assistant:

static void canvas_dosettracing(t_canvas *x, int onoff)
{
    t_gobj *y;
    for (y = x->gl_list; y; y = y->g_next)
    {
        t_object *ob;
        if (pd_class(&y->g_pd) == canvas_class)
            canvas_dosettracing((t_canvas *)y, onoff);
        if ((ob = pd_checkobject(&y->g_pd)))
            obj_dosettracing(ob, onoff);
    }
}